

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O3

Storyboard * __thiscall
ApprovalTests::Storyboard::addFrame(Storyboard *this,string *title,string *frame)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (this->addNewLineBeforeNextFrame_ == true) {
    uStack_28 = CONCAT17(10,(int7)in_RAX);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->field_0x10,(char *)((long)&uStack_28 + 7),1);
    this->addNewLineBeforeNextFrame_ = false;
  }
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x10,(title->_M_dataplus)._M_p,title->_M_string_length
                     );
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,":\n",2);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x10,(frame->_M_dataplus)._M_p,frame->_M_string_length
                     );
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
  this->frameCount_ = this->frameCount_ + 1;
  return this;
}

Assistant:

Storyboard& Storyboard::addFrame(const std::string& title, const std::string& frame)
    {
        if (addNewLineBeforeNextFrame_)
        {
            output_ << '\n';
            addNewLineBeforeNextFrame_ = false;
        }
        output_ << title << ":\n";
        output_ << frame << "\n\n";
        frameCount_ += 1;
        return *this;
    }